

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O0

int Ssw_StrSimMatchingCountUnmached(Aig_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int local_20;
  int local_1c;
  int Counter;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_1c);
    if ((pAVar2 != (Aig_Obj_t *)0x0) &&
       (((iVar1 = Aig_ObjIsNode(pAVar2), iVar1 != 0 || (iVar1 = Aig_ObjIsCi(pAVar2), iVar1 != 0)) &&
        (pAVar2 = Aig_ObjRepr(p,pAVar2), pAVar2 == (Aig_Obj_t *)0x0)))) {
      local_20 = local_20 + 1;
    }
  }
  return local_20;
}

Assistant:

int Ssw_StrSimMatchingCountUnmached( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        if ( Aig_ObjRepr( p, pObj ) != NULL )
            continue;
        Counter++;
    }
    return Counter;
}